

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

bool __thiscall llvm::detail::DoubleAPFloat::isDenormal(DoubleAPFloat *this)

{
  Storage *this_00;
  APFloat *pAVar1;
  APFloat *pAVar2;
  bool bVar3;
  cmpResult cVar4;
  bool bVar5;
  APFloat AStack_48;
  
  pAVar1 = (this->Floats)._M_t.
           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
           super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
  pAVar2 = (APFloat *)(pAVar1->U).IEEE.significand.part;
  if ((pAVar1->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    pAVar2 = pAVar1;
  }
  if ((*(undefined1 *)((long)&pAVar2->U + 0x12) & 7) == 2) {
    bVar3 = APFloat::isDenormal(pAVar1);
    bVar5 = true;
    if (!bVar3) {
      bVar3 = APFloat::isDenormal((this->Floats)._M_t.
                                  super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                                  .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1);
      if (!bVar3) {
        pAVar1 = (this->Floats)._M_t.
                 super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                 super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                 super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
        this_00 = &AStack_48.U;
        if ((pAVar1->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
          DoubleAPFloat((DoubleAPFloat *)&this_00->IEEE,(DoubleAPFloat *)&(pAVar1->U).IEEE);
        }
        else {
          IEEEFloat::IEEEFloat(&this_00->IEEE,&(pAVar1->U).IEEE);
        }
        APFloat::add(&AStack_48,pAVar1 + 1,rmNearestTiesToEven);
        cVar4 = APFloat::compare(pAVar1,&AStack_48);
        bVar5 = cVar4 != cmpEqual;
        APFloat::Storage::~Storage((Storage *)&this_00->IEEE);
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool DoubleAPFloat::isDenormal() const {
  return getCategory() == fcNormal &&
         (Floats[0].isDenormal() || Floats[1].isDenormal() ||
          // (double)(Hi + Lo) == Hi defines a normal number.
          Floats[0].compare(Floats[0] + Floats[1]) != cmpEqual);
}